

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::runCloningDestinationFilters
          (FilterFederate *this,FilterCoordinator *fcoord,BasicHandleInfo *handle,
          ActionMessage *command)

{
  GlobalFederateId fed;
  element_type *peVar1;
  Message *pMVar2;
  pointer puVar3;
  __type _Var4;
  FilterInfo *pFVar5;
  pointer ppFVar6;
  pointer puVar7;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  ActionMessage cmd;
  _Head_base<0UL,_helics::Message_*,_false> local_140;
  _Head_base<0UL,_helics::Message_*,_false> local_138;
  function<void_(const_helics::ActionMessage_&)> *local_130;
  function<void_(helics::ActionMessage_&&)> *local_128;
  function<void_(helics::ActionMessage_&)> *local_120;
  BasicHandleInfo *local_118;
  pointer local_110;
  helics local_108 [8];
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_100;
  undefined1 local_e8 [184];
  
  (this->mCoord).triggered = true;
  local_110 = (fcoord->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_130 = &this->mSendMessage;
  local_120 = &this->mDeliverMessage;
  local_128 = &this->mSendMessageMove;
  local_118 = handle;
  for (ppFVar6 = (fcoord->cloningDestFilters).
                 super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar6 != local_110;
      ppFVar6 = ppFVar6 + 1) {
    pFVar5 = *ppFVar6;
    if ((pFVar5->flags & 0x1000) == 0) {
      fed.gid = (this->mFedID).gid;
      if (((GlobalFederateId *)&pFVar5->core_id)->gid == fed.gid) {
        pFVar5 = getFilterInfo(this,fed,(InterfaceHandle)(pFVar5->handle).hid);
        if ((pFVar5 != (FilterInfo *)0x0) &&
           (peVar1 = (pFVar5->filterOp).
                     super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar1 != (element_type *)0x0)) {
          createMessageFromCommand(local_108,command);
          (*peVar1->_vptr_FilterOperator[3])(&local_100,peVar1,local_108);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_108
                    );
          puVar3 = local_100.
                   super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar7 = local_100.
                        super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
              puVar7 = puVar7 + 1) {
            pMVar2 = (puVar7->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
            if (pMVar2 != (Message *)0x0) {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&pMVar2->dest,&handle->key);
              if (_Var4) {
                local_138._M_head_impl =
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
                (puVar7->_M_t).
                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
                ActionMessage::ActionMessage
                          ((ActionMessage *)local_e8,
                           (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_138);
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_138);
                local_e8._16_8_ = local_118->handle;
                std::function<void_(helics::ActionMessage_&&)>::operator()
                          (local_128,(ActionMessage *)local_e8);
                ActionMessage::~ActionMessage((ActionMessage *)local_e8);
              }
              else {
                local_140._M_head_impl =
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
                (puVar7->_M_t).
                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
                ActionMessage::ActionMessage
                          ((ActionMessage *)local_e8,
                           (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_140);
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           &local_140);
                std::function<void_(helics::ActionMessage_&)>::operator()
                          (local_120,(ActionMessage *)local_e8);
                ActionMessage::~ActionMessage((ActionMessage *)local_e8);
              }
            }
          }
          std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::~vector(&local_100);
        }
      }
      else {
        ActionMessage::ActionMessage((ActionMessage *)local_e8,command);
        ActionMessage::setAction((ActionMessage *)local_e8,cmd_send_for_filter);
        local_e8._16_4_ = (pFVar5->core_id).gid;
        local_e8._20_4_ = (pFVar5->handle).hid;
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  (local_130,(ActionMessage *)local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::runCloningDestinationFilters(const FilterCoordinator* fcoord,
                                                  const BasicHandleInfo* handle,
                                                  const ActionMessage& command) const
{
    mCoord.triggered = true;
    // now go to the cloning filters
    for (auto* clFilter : fcoord->cloningDestFilters) {
        if (checkActionFlag(*clFilter, disconnected_flag)) {
            continue;
        }
        if (clFilter->core_id == mFedID) {
            const auto* FiltI = getFilterInfo(mFedID, clFilter->handle);
            if (FiltI != nullptr) {
                if (FiltI->filterOp != nullptr) {
                    // this is a cloning filter so it generates a bunch(?) of new
                    // messages
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(command));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            if (msg->dest == handle->key) {
                                // in case the clone filter send to itself.
                                ActionMessage cmd(std::move(msg));
                                cmd.dest_id = handle->handle.fed_id;
                                cmd.dest_handle = handle->handle.handle;
                                mSendMessageMove(std::move(cmd));
                            } else {
                                ActionMessage cmd(std::move(msg));
                                mDeliverMessage(cmd);
                            }
                        }
                    }
                }
            }
        } else {
            ActionMessage clone(command);
            clone.setAction(CMD_SEND_FOR_FILTER);
            clone.dest_id = clFilter->core_id;
            clone.dest_handle = clFilter->handle;
            mSendMessage(clone);
        }
    }
}